

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGuiStb::is_word_boundary_from_right(ImGuiTextEditState *obj,int idx)

{
  bool bVar1;
  value_type_conflict *pvVar2;
  uint local_1c;
  byte local_15;
  int idx_local;
  ImGuiTextEditState *obj_local;
  
  if (idx < 1) {
    local_1c = 1;
  }
  else {
    pvVar2 = ImVector<unsigned_short>::operator[](&obj->Text,idx + -1);
    bVar1 = is_separator((uint)*pvVar2);
    local_15 = 0;
    if (bVar1) {
      pvVar2 = ImVector<unsigned_short>::operator[](&obj->Text,idx);
      bVar1 = is_separator((uint)*pvVar2);
      local_15 = bVar1 ^ 0xff;
    }
    local_1c = (uint)(local_15 & 1);
  }
  return local_1c;
}

Assistant:

static int  is_word_boundary_from_right(STB_TEXTEDIT_STRING* obj, int idx)      { return idx > 0 ? (is_separator( obj->Text[idx-1] ) && !is_separator( obj->Text[idx] ) ) : 1; }